

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O1

int __thiscall TokenBuffer::LA(TokenBuffer *this,int i)

{
  int iVar1;
  RefCount<Token> local_18;
  
  fill(this,i);
  local_18.ref = (this->queue).storage.
                 super__Vector_base<RefCount<Token>,_std::allocator<RefCount<Token>_>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)i + (long)this->markerOffset + -1].ref;
  (local_18.ref)->count = (local_18.ref)->count + 1;
  iVar1 = (local_18.ref)->ptr->type;
  RefCount<Token>::~RefCount(&local_18);
  return iVar1;
}

Assistant:

int TokenBuffer::LA(int i)
{
	fill(i);
	return queue.elementAt(markerOffset+i-1)->type;
}